

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mycontroller.cpp
# Opt level: O3

void Mycontroller::control(shared_ptr<Car> *car,SDL_Event *e)

{
  Car *pCVar1;
  int iVar2;
  _Alloc_hider _Var3;
  element_type *this;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar2 = (e->window).data2;
  switch(iVar2) {
  case 0x4000004f:
    pCVar1 = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"horizontal","");
    Car::setAxis(pCVar1,&local_a0);
    local_60.field_2._M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
    _Var3._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_00107853:
      operator_delete(_Var3._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0x40000050:
    pCVar1 = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"horizontal","");
    Car::setAxis(pCVar1,&local_80);
    local_40.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    _Var3._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
LAB_001078ee:
      operator_delete(_Var3._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    goto LAB_001078f6;
  case 0x40000051:
    pCVar1 = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"vertical","");
    Car::setAxis(pCVar1,&local_60);
    _Var3._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) goto LAB_00107853;
    break;
  case 0x40000052:
    pCVar1 = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vertical","");
    Car::setAxis(pCVar1,&local_40);
    _Var3._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) goto LAB_001078ee;
LAB_001078f6:
    this = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar2 = -1;
    goto LAB_001078fe;
  default:
    if ((iVar2 != 0x400000e0) && (iVar2 != 0x400000e4)) {
      return;
    }
    switchCars = !switchCars;
    return;
  }
  this = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = 1;
LAB_001078fe:
  Car::setDirection(this,iVar2);
  return;
}

Assistant:

void Mycontroller::control( std::shared_ptr<Car>  car,  SDL_Event& e){


      switch (e.key.keysym.sym) {
        case SDLK_UP:
          car->setAxis("vertical");
          car->setDirection(-1);
          break;

        case SDLK_DOWN:
          car->setAxis("vertical");
          car->setDirection(1);   
          break;

        case SDLK_LEFT:
          car->setAxis("horizontal");    
          car->setDirection(-1);
          break;

        case SDLK_RIGHT:
          car->setAxis("horizontal");
          car->setDirection(1);
        
        break;        
        
        case SDLK_RCTRL:
          Mycontroller::switchCars = !Mycontroller::switchCars;
        break;
                
        case SDLK_LCTRL:
          Mycontroller::switchCars = !Mycontroller::switchCars;
        break;
      }
    }